

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Option<unsigned_long> __thiscall Catch::list(Catch *this,Config *config)

{
  bool bVar1;
  unsigned_long uVar2;
  size_t sVar3;
  char extraout_RDX [8];
  char extraout_RDX_00 [8];
  char acVar4 [8];
  Option<unsigned_long> OVar5;
  unsigned_long local_70;
  unsigned_long local_68 [3];
  unsigned_long local_50;
  unsigned_long local_48 [5];
  undefined1 local_19;
  Config *local_18;
  Config *config_local;
  Option<unsigned_long> *listedCount;
  
  local_19 = 0;
  local_18 = config;
  config_local = (Config *)this;
  Option<unsigned_long>::Option((Option<unsigned_long> *)this);
  bVar1 = Config::listTests(local_18);
  if (bVar1) {
    local_48[1] = 0;
    uVar2 = Option<unsigned_long>::valueOr((Option<unsigned_long> *)this,local_48 + 1);
    sVar3 = listTests(local_18);
    local_48[2] = uVar2 + sVar3;
    Option<unsigned_long>::operator=((Option<unsigned_long> *)this,local_48 + 2);
  }
  bVar1 = Config::listTestNamesOnly(local_18);
  if (bVar1) {
    local_50 = 0;
    uVar2 = Option<unsigned_long>::valueOr((Option<unsigned_long> *)this,&local_50);
    sVar3 = listTestsNamesOnly(local_18);
    local_48[0] = uVar2 + sVar3;
    Option<unsigned_long>::operator=((Option<unsigned_long> *)this,local_48);
  }
  bVar1 = Config::listTags(local_18);
  if (bVar1) {
    local_68[1] = 0;
    uVar2 = Option<unsigned_long>::valueOr((Option<unsigned_long> *)this,local_68 + 1);
    sVar3 = listTags(local_18);
    local_68[2] = uVar2 + sVar3;
    Option<unsigned_long>::operator=((Option<unsigned_long> *)this,local_68 + 2);
  }
  bVar1 = Config::listReporters(local_18);
  acVar4 = extraout_RDX;
  if (bVar1) {
    local_70 = 0;
    uVar2 = Option<unsigned_long>::valueOr((Option<unsigned_long> *)this,&local_70);
    sVar3 = listReporters(local_18);
    local_68[0] = uVar2 + sVar3;
    Option<unsigned_long>::operator=((Option<unsigned_long> *)this,local_68);
    acVar4 = extraout_RDX_00;
  }
  OVar5.storage[0] = acVar4[0];
  OVar5.storage[1] = acVar4[1];
  OVar5.storage[2] = acVar4[2];
  OVar5.storage[3] = acVar4[3];
  OVar5.storage[4] = acVar4[4];
  OVar5.storage[5] = acVar4[5];
  OVar5.storage[6] = acVar4[6];
  OVar5.storage[7] = acVar4[7];
  OVar5.nullableValue = (unsigned_long *)this;
  return OVar5;
}

Assistant:

inline Option<std::size_t> list( Config const& config ) {
        Option<std::size_t> listedCount;
        if( config.listTests() )
            listedCount = listedCount.valueOr(0) + listTests( config );
        if( config.listTestNamesOnly() )
            listedCount = listedCount.valueOr(0) + listTestsNamesOnly( config );
        if( config.listTags() )
            listedCount = listedCount.valueOr(0) + listTags( config );
        if( config.listReporters() )
            listedCount = listedCount.valueOr(0) + listReporters( config );
        return listedCount;
    }